

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O2

void * __thiscall rapidxml::memory_pool<char>::allocate_aligned(memory_pool<char> *this,size_t size)

{
  char *pcVar1;
  ulong uVar2;
  size_t size_00;
  
  pcVar1 = this->m_ptr + (-(int)this->m_ptr & 7);
  if (this->m_end < pcVar1 + size) {
    size_00 = 0x10016;
    if (0x10000 < size) {
      size_00 = size + 0x16;
    }
    pcVar1 = allocate_raw(this,size_00);
    uVar2 = (ulong)(-(int)pcVar1 & 7);
    *(char **)(pcVar1 + uVar2 + 8 + -8) = this->m_begin;
    this->m_begin = pcVar1;
    this->m_end = pcVar1 + size_00;
    pcVar1 = pcVar1 + (ulong)(-(int)(pcVar1 + uVar2 + 8) & 7) + 8 + uVar2;
  }
  this->m_ptr = pcVar1 + size;
  return pcVar1;
}

Assistant:

void *allocate_aligned(std::size_t size)
        {
            // Calculate aligned pointer
            char *result = align(m_ptr);

            // If not enough memory left in current pool, allocate a new pool
            if (result + size > m_end)
            {
                // Calculate required pool size (may be bigger than RAPIDXML_DYNAMIC_POOL_SIZE)
                std::size_t pool_size = RAPIDXML_DYNAMIC_POOL_SIZE;
                if (pool_size < size)
                    pool_size = size;
                
                // Allocate
                std::size_t alloc_size = sizeof(header) + (2 * RAPIDXML_ALIGNMENT - 2) + pool_size;     // 2 alignments required in worst case: one for header, one for actual allocation
                char *raw_memory = allocate_raw(alloc_size);
                    
                // Setup new pool in allocated memory
                char *pool = align(raw_memory);
                header *new_header = reinterpret_cast<header *>(pool);
                new_header->previous_begin = m_begin;
                m_begin = raw_memory;
                m_ptr = pool + sizeof(header);
                m_end = raw_memory + alloc_size;

                // Calculate aligned pointer again using new pool
                result = align(m_ptr);
            }

            // Update pool and return aligned pointer
            m_ptr = result + size;
            return result;
        }